

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O2

void __thiscall duckdb::WriteParquetDecimal(duckdb *this,hugeint_t input,data_ptr_t result)

{
  bool bVar1;
  unsigned_long shift_count;
  long lVar2;
  byte *pbVar3;
  byte *pbVar4;
  hugeint_t hVar5;
  hugeint_t local_60;
  hugeint_t local_50;
  hugeint_t local_40;
  hugeint_t local_30;
  
  pbVar3 = (byte *)input.upper;
  local_60.upper = input.lower;
  local_60.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_50,0);
  bVar1 = hugeint_t::operator>=(&local_60,&local_50);
  if (bVar1) {
    hVar5.upper = local_60.upper;
    hVar5.lower = local_60.lower;
  }
  else {
    local_30.lower = 0xffffffffffffffff;
    local_30.upper = 0x7fffffffffffffff;
    local_50 = hugeint_t::operator+(&local_30,&local_60);
    hugeint_t::hugeint_t(&local_40,1);
    hVar5 = hugeint_t::operator+(&local_50,&local_40);
  }
  pbVar4 = pbVar3;
  for (lVar2 = 0x38; lVar2 != -8; lVar2 = lVar2 + -8) {
    *pbVar4 = (byte)((ulong)hVar5.upper >> ((byte)lVar2 & 0x3f));
    pbVar4 = pbVar4 + 1;
  }
  pbVar4 = pbVar3 + 8;
  for (lVar2 = 0x38; lVar2 != -8; lVar2 = lVar2 + -8) {
    *pbVar4 = (byte)(hVar5.lower >> ((byte)lVar2 & 0x3f));
    pbVar4 = pbVar4 + 1;
  }
  if (!bVar1) {
    *pbVar3 = *pbVar3 | 0x80;
  }
  return;
}

Assistant:

static void WriteParquetDecimal(hugeint_t input, data_ptr_t result) {
	bool positive = input >= 0;
	// numbers are stored as two's complement so some muckery is required
	if (!positive) {
		input = NumericLimits<hugeint_t>::Maximum() + input + 1;
	}
	uint64_t high_bytes = uint64_t(input.upper);
	uint64_t low_bytes = input.lower;

	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[i] = (high_bytes >> shift_count) & 0xFF;
	}
	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[sizeof(uint64_t) + i] = (low_bytes >> shift_count) & 0xFF;
	}
	if (!positive) {
		result[0] |= 0x80;
	}
}